

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationTest.cpp
# Opt level: O1

void initGlobals(int argc,char **argv)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (argc < 2) {
    local_48 = &local_38;
    local_40 = 0;
    local_38 = 0;
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x119cd8);
    local_a8 = &local_98;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_98 = *plVar3;
      lStack_90 = plVar2[3];
    }
    else {
      local_98 = *plVar3;
      local_a8 = (long *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,argv[1],(allocator *)&local_48);
  }
  std::__cxx11::string::operator=((string *)&g_bread_path_abi_cxx11_,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((argc < 2) && (local_48 != &local_38)) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (argc < 3) {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"./","");
  }
  else {
    pcVar1 = argv[2];
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"/","");
    strlen(pcVar1);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,(ulong)pcVar1);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_98 = *plVar3;
      lStack_90 = plVar2[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar3;
      local_a8 = (long *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  std::__cxx11::string::operator=((string *)&g_inttest_dir_abi_cxx11_,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((2 < argc) && (local_68[0] != local_58)) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (argc < 4) {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"../test/integration/","");
  }
  else {
    pcVar1 = argv[3];
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"/test/integration/","");
    strlen(pcVar1);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,(ulong)pcVar1);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_98 = *plVar3;
      lStack_90 = plVar2[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar3;
      local_a8 = (long *)*plVar2;
    }
    local_a0 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  std::__cxx11::string::operator=((string *)&g_src_dir_abi_cxx11_,(string *)&local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((3 < argc) && (local_88[0] != local_78)) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

void initGlobals(int argc, const char* argv[])
{
  g_bread_path = (argc > 1) ? argv[1] : "./bread" + extension();
  g_inttest_dir = (argc > 2) ? argv[2] + std::string("/") : "./";
  g_src_dir = (argc > 3) ? argv[3] + std::string("/test/integration/") : "../test/integration/";
}